

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim_circuit.cpp
# Opt level: O1

SimComponent * __thiscall lsim::SimCircuit::add_component(SimCircuit *this,ModelComponent *comp)

{
  Simulator *pSVar1;
  undefined1 auVar2 [8];
  pin_t pVar3;
  pin_t pVar4;
  SimComponent *this_00;
  mapped_type *ppSVar5;
  pin_id_t pVar6;
  size_t sVar7;
  unique_ptr<lsim::SimCircuit,_std::default_delete<lsim::SimCircuit>_> nested_instance;
  undefined1 local_40 [8];
  _Head_base<0UL,_lsim::SimCircuit_*,_false> local_38;
  
  if (comp != (ModelComponent *)0x0) {
    this_00 = Simulator::create_component(this->m_sim,comp);
    local_40._0_4_ = comp->m_id;
    ppSVar5 = std::__detail::
              _Map_base<unsigned_int,_std::pair<const_unsigned_int,_lsim::SimComponent_*>,_std::allocator<std::pair<const_unsigned_int,_lsim::SimComponent_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_lsim::SimComponent_*>,_std::allocator<std::pair<const_unsigned_int,_lsim::SimComponent_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->m_components,(key_type *)local_40);
    *ppSVar5 = this_00;
    if (comp->m_type == 0x301) {
      ModelCircuit::instantiate
                ((ModelCircuit *)local_40,(Simulator *)comp->m_nested_circuit,SUB81(this->m_sim,0));
      build_name((SimCircuit *)local_40,comp->m_id);
      if (this_00->m_output_start != 0) {
        sVar7 = 0;
        do {
          auVar2 = local_40;
          pVar6 = ModelCircuit::port_by_index(comp->m_nested_circuit,true,sVar7);
          pVar3 = pin_from_pin_id((SimCircuit *)auVar2,pVar6);
          pSVar1 = this->m_sim;
          pVar4 = SimComponent::pin_by_index(this_00,(uint32_t)sVar7);
          Simulator::connect_pins(pSVar1,pVar3,pVar4);
          sVar7 = sVar7 + 1;
        } while ((uint)sVar7 < this_00->m_output_start);
      }
      if (this_00->m_control_start != this_00->m_output_start) {
        sVar7 = 0;
        do {
          auVar2 = local_40;
          pVar6 = ModelCircuit::port_by_index(comp->m_nested_circuit,false,sVar7);
          pVar3 = pin_from_pin_id((SimCircuit *)auVar2,pVar6);
          pSVar1 = this->m_sim;
          pVar4 = SimComponent::pin_by_index(this_00,this_00->m_output_start + (int)sVar7);
          Simulator::connect_pins(pSVar1,pVar3,pVar4);
          sVar7 = sVar7 + 1;
        } while ((uint)sVar7 < this_00->m_control_start - this_00->m_output_start);
      }
      local_38._M_head_impl = (SimCircuit *)local_40;
      local_40 = (undefined1  [8])0x0;
      SimComponent::set_nested_instance
                (this_00,(unique_ptr<lsim::SimCircuit,_std::default_delete<lsim::SimCircuit>_> *)
                         &local_38);
      if ((LSimContext *)local_38._M_head_impl != (LSimContext *)0x0) {
        std::default_delete<lsim::SimCircuit>::operator()
                  ((default_delete<lsim::SimCircuit> *)&local_38,local_38._M_head_impl);
      }
      local_38._M_head_impl = (SimCircuit *)0x0;
      if (local_40 != (undefined1  [8])0x0) {
        std::default_delete<lsim::SimCircuit>::operator()
                  ((default_delete<lsim::SimCircuit> *)local_40,(SimCircuit *)local_40);
      }
    }
    return this_00;
  }
  __assert_fail("comp",
                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/sim_circuit.cpp"
                ,0x16,"SimComponent *lsim::SimCircuit::add_component(ModelComponent *)");
}

Assistant:

SimComponent *SimCircuit::add_component(ModelComponent *comp) {
    assert(comp);
    auto sim_comp = m_sim->create_component(comp);
    m_components[comp->id()] = sim_comp;

    if (comp->type() == COMPONENT_SUB_CIRCUIT) {
        auto nested_instance = comp->nested_circuit()->instantiate(m_sim, false);
        nested_instance->build_name(comp->id());

        for (auto idx = 0u; idx < sim_comp->num_inputs(); ++idx) {
            auto nested_pin = nested_instance->pin_from_pin_id(comp->nested_circuit()->port_by_index(true, idx));
            m_sim->connect_pins(nested_pin, sim_comp->pin_by_index(sim_comp->input_pin_index(idx)));
        }        

        for (auto idx = 0u; idx < sim_comp->num_outputs(); ++idx) {
            auto nested_pin = nested_instance->pin_from_pin_id(comp->nested_circuit()->port_by_index(false, idx));
            m_sim->connect_pins(nested_pin, sim_comp->pin_by_index(sim_comp->output_pin_index(idx)));
        }        

        sim_comp->set_nested_instance(std::move(nested_instance));
    }
    return sim_comp;
}